

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O1

uint embree::createClothSheet(RTCScene scene)

{
  vector<Triangle,_std::allocator<Triangle>_> *this;
  pointer *pppCVar1;
  unsigned_long uVar2;
  iterator __position;
  unsigned_long *puVar3;
  int iVar4;
  uint uVar5;
  ClothModel *cloth;
  ulong uVar6;
  Constraint *pCVar7;
  size_t *psVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  unsigned_long *puVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sIDs;
  vec_t gravity;
  vec_t nullvec;
  Constraint *local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  RTCScene local_70;
  vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>> *local_68;
  code *local_60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  cloth = (ClothModel *)operator_new(0x118);
  memset(cloth,0,0x118);
  (cloth->super_Mesh)._vptr_Mesh = (_func_int **)&PTR__ClothModel_002cec00;
  memset(&cloth->x_0_,0,0xd8);
  cloth->k_stretch_ = 1.0;
  cloth->k_damp_ = 1.0;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize(&cloth->x_0_,NZ * NX);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (&(cloth->super_Mesh).x_,NZ * NX);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize(&cloth->x_old_,NZ * NX);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize(&cloth->x_last_,NZ * NX);
  local_48._0_8_ = 0;
  local_48._8_8_ = 0;
  local_58._0_8_ = 0xc11ccccd00000000;
  local_58._8_8_ = 0;
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (&cloth->v_,NZ * NX,(value_type *)&local_48.field_1);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            (&cloth->a_,NZ * NX,(value_type *)&local_58.field_1);
  std::vector<float,_std::allocator<float>_>::resize(&cloth->m_,NZ * NX,(value_type_conflict1 *)&m);
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::resize
            (&cloth->m_inv_,NZ * NX,(value_type_conflict1 *)&local_88);
  this = &(cloth->super_Mesh).tris_;
  std::vector<Triangle,_std::allocator<Triangle>_>::resize(this,(NZ - 1) * (NX * 2 + -2));
  initializeClothPositions(cloth);
  if (NX != 1) {
    iVar4 = 1;
    lVar10 = 0;
    uVar14 = 0;
    do {
      if (NZ != 1) {
        lVar15 = 0xc;
        uVar17 = 0;
        do {
          iVar13 = (int)uVar14;
          iVar16 = (int)uVar17;
          *(int *)((long)&(this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                          super__Vector_impl_data._M_start[-1].v0 +
                  (NZ + 0x7fffffffffffffff) * lVar10 + lVar15) = iVar13 * (int)NZ + iVar16;
          *(int *)((long)(this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                         super__Vector_impl_data._M_start +
                  lVar15 + -8 + (NZ + 0x7fffffffffffffff) * lVar10) = (int)NZ * iVar13 + iVar16 + 1;
          *(int *)((long)(this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                         super__Vector_impl_data._M_start +
                  lVar15 + -4 + (NZ + 0x7fffffffffffffff) * lVar10) = iVar4 * (int)NZ + iVar16 + 1;
          *(int *)((long)&((this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                           super__Vector_impl_data._M_start)->v0 +
                  lVar15 + (NZ + 0x7fffffffffffffff) * lVar10) = (int)NZ * iVar4 + iVar16 + 1;
          *(int *)((long)&((this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                           super__Vector_impl_data._M_start)->v1 +
                  lVar15 + (NZ + 0x7fffffffffffffff) * lVar10) = (int)NZ * iVar4 + iVar16;
          *(int *)((long)&((this->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
                           super__Vector_impl_data._M_start)->v2 +
                  lVar15 + (NZ + 0x7fffffffffffffff) * lVar10) = (int)NZ * iVar13 + iVar16;
          uVar17 = uVar17 + 1;
          lVar15 = lVar15 + 0x18;
        } while (uVar17 < NZ - 1);
      }
      uVar14 = uVar14 + 1;
      lVar10 = lVar10 + 0x18;
      iVar4 = iVar4 + 1;
    } while (uVar14 < NX - 1U);
  }
  cloth->k_stretch_ = 4000.0;
  cloth->k_damp_ = 0.2;
  local_70 = scene;
  if (NZ * NX != 0) {
    local_60 = collide2::DistanceConstraint::initConstraint;
    local_68 = (vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>
                *)&cloth->m_constraints_;
    uVar14 = 0;
    do {
      uVar17 = NZ;
      uVar6 = uVar14 / NZ;
      uVar11 = uVar14 % NZ;
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      if (uVar6 < NX - 1U) {
        local_90 = (Constraint *)(NZ + uVar14);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_88,(iterator)0x0,(unsigned_long *)&local_90);
      }
      if (uVar11 < NZ - 1) {
        local_90 = (Constraint *)(uVar14 + 1);
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_90);
        }
        else {
          *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_90;
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((uVar6 < NX - 1U) && (uVar11 < NZ - 1)) {
        local_90 = (Constraint *)(NZ + uVar14 + 1);
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_90);
        }
        else {
          *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_90;
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar12 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((uVar17 <= uVar14) && (uVar11 < NZ - 1)) {
        local_90 = (Constraint *)((uVar14 - NZ) + 1);
        if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&local_88,
                     (iterator)
                     local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_90);
          puVar12 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar3 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = (unsigned_long)local_90;
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          puVar3 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      for (; puVar12 != puVar3; puVar12 = puVar12 + 1) {
        uVar2 = *puVar12;
        pCVar7 = (Constraint *)operator_new(0x28);
        pCVar7->_vptr_Constraint = (_func_int **)&PTR__Constraint_002cec38;
        pCVar7->numConstrainedBodies_ = 2;
        pCVar7->bodyIDs_ = (size_t *)0x0;
        psVar8 = (size_t *)operator_new__(0x10);
        pCVar7->bodyIDs_ = psVar8;
        pCVar7->_vptr_Constraint = (_func_int **)&PTR__Constraint_002ced48;
        pCVar7[1]._vptr_Constraint = (_func_int **)0x0;
        *(undefined4 *)&pCVar7[1].numConstrainedBodies_ = 0;
        (*local_60)(pCVar7,cloth,uVar14,uVar2);
        __position._M_current =
             (cloth->m_constraints_).
             super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_90 = pCVar7;
        if (__position._M_current ==
            (cloth->m_constraints_).
            super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<embree::collide2::Constraint*,std::allocator<embree::collide2::Constraint*>>::
          _M_realloc_insert<embree::collide2::Constraint*>(local_68,__position,&local_90);
        }
        else {
          *__position._M_current = pCVar7;
          pppCVar1 = &(cloth->m_constraints_).
                      super__Vector_base<embree::collide2::Constraint_*,_std::allocator<embree::collide2::Constraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
      }
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < NZ * NX);
  }
  uVar9 = rtcNewGeometry(g_device,0x78);
  uVar5 = rtcAttachGeometry(local_70,uVar9);
  rtcSetGeometryUserPrimitiveCount
            (uVar9,(int)((ulong)((long)(cloth->super_Mesh).tris_.
                                       super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)(cloth->super_Mesh).tris_.
                                      super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555)
  ;
  rtcSetGeometryUserData(uVar9,uVar5);
  rtcSetGeometryBoundsFunction(uVar9,triangle_bounds_func,0);
  rtcSetGeometryIntersectFunction(uVar9,triangle_intersect_func);
  rtcCommitGeometry(uVar9);
  rtcReleaseGeometry(uVar9);
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cloth;
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
  ::
  emplace_back<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>
            ((vector<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>,std::allocator<std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>>>
              *)&meshes,
             (unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             &local_88);
  if ((ClothModel *)
      local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ClothModel *)0x0) {
    (*((Mesh *)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start)->_vptr_Mesh[1])();
  }
  return uVar5;
}

Assistant:

unsigned int createClothSheet (RTCScene scene)
{
  std::unique_ptr<collide2::ClothModel> cloth (new collide2::ClothModel());
  cloth->x_0_.resize (NX*NZ);
  cloth->x_.resize (NX*NZ);
  cloth->x_old_.resize (NX*NZ);
  cloth->x_last_.resize (NX*NZ);
  collide2::vec_t nullvec(0.f, 0.f, 0.f);
  collide2::vec_t gravity(0.f, -9.8f, 0.f);
  cloth->v_.resize (NX*NZ, nullvec);
  cloth->a_.resize (NX*NZ, gravity);
  cloth->m_.resize (NX*NZ, m);
  cloth->m_inv_.resize (NX*NZ, 1.f / m);
  cloth->tris_.resize (2*(NX-1)*(NZ-1));

  initializeClothPositions (*cloth);

  // init topology
  for (size_t i=0; i<NX-1; ++i) {
    for (size_t j=0; j<NZ-1; ++j) {
      cloth->tris_[2*(i*(NZ-1)+j)].v0 = i*NZ+j;
      cloth->tris_[2*(i*(NZ-1)+j)].v1 = i*NZ+j+1;
      cloth->tris_[2*(i*(NZ-1)+j)].v2 = (i+1)*NZ+j+1;

      cloth->tris_[2*(i*(NZ-1)+j)+1].v0 = (i+1)*NZ+j+1;
      cloth->tris_[2*(i*(NZ-1)+j)+1].v1 = (i+1)*NZ+j;
      cloth->tris_[2*(i*(NZ-1)+j)+1].v2 = i*NZ+j;
    }
  }

  cloth->k_stretch_ = ks;
  cloth->k_damp_ = damping;

  // set distance constraints
  for (size_t vID=0; vID<NX*NZ; ++vID) {
    
    size_t i = vID/NZ;
    size_t j = vID%NZ;

    std::vector<size_t> sIDs;

    if (i<NX-1) sIDs.push_back (vID+NZ);
    if (j<NZ-1) sIDs.push_back (vID+1);

    if (i<NX-1) {
      if (j<NZ-1) {
        sIDs.push_back (vID+NZ+1);
      }
    }

    if (i>0) {
      if (j<NZ-1) {
        sIDs.push_back (vID-NZ+1);
      }
    }

    for (auto id : sIDs) {
      auto c = new collide2::DistanceConstraint ();
      c->initConstraint (*cloth, vID, id);
      cloth->m_constraints_.push_back (c);
    }
  }

  // fix corners
  // cloth->m_[0] = 0.f;
  // cloth->m_[(NX-1)*NZ] = 0.f;
  // cloth->m_[(NX-1)*NZ + NZ-1] = 0.f;
  // cloth->m_[NZ-1] = 0.f;
  // cloth->m_inv_[0] = 0.f;
  // cloth->m_inv_[(NX-1)*NZ] = 0.f;
  // cloth->m_inv_[(NX-1)*NZ + NZ-1] = 0.f;
  // cloth->m_inv_[NZ-1] = 0.f;
  // cloth->a_[0].y = 0.f;
  // cloth->a_[(NX-1)*NZ].y = 0.f;
  // cloth->a_[(NX-1)*NZ + NZ-1].y = 0.f;
  // cloth->a_[NZ-1].y = 0.f;

  // if (use_user_geometry) {
    RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_USER);
    unsigned int geomID = rtcAttachGeometry(scene,geom);
    rtcSetGeometryUserPrimitiveCount(geom, cloth->tris_.size());
    rtcSetGeometryUserData(geom,(void*)(size_t)geomID);
    rtcSetGeometryBoundsFunction   (geom, triangle_bounds_func, nullptr);
    rtcSetGeometryIntersectFunction(geom, triangle_intersect_func);
    rtcCommitGeometry(geom);
    rtcReleaseGeometry(geom);
    meshes.push_back (std::move (cloth));
    return geomID;
  // } else {
  //   RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  //   rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT3, cloth->x_.data(), 0, sizeof(collide2::vec_t), cloth->x_.size());
  //   rtcSetSharedGeometryBuffer(geom, RTC_BUFFER_TYPE_INDEX , 0, RTC_FORMAT_UINT3,  cloth->tris_.data(), 0, sizeof(Triangle), cloth->tris_.size());
  //   rtcCommitGeometry(geom);
  //   unsigned int geomID = rtcAttachGeometry(scene,geom);
  //   rtcReleaseGeometry(geom);
  //   meshes.push_back (std::move (cloth));
  //   return geomID;
  // }
}